

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

Vec_Int_t * Fra_ClauSaveLatchVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf,int fCsVars)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  iVar1 = pMan->nRegs;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar2;
  iVar1 = pMan->nRegs;
  if (0 < iVar1) {
    iVar5 = 0;
    do {
      uVar4 = (pMan->nObjs[3] - iVar1) + iVar5;
      if (((((int)uVar4 < 0) || (pMan->vCos->nSize <= (int)uVar4)) ||
          (uVar6 = (pMan->nObjs[2] - iVar1) + iVar5, (int)uVar6 < 0)) ||
         (pMan->vCis->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (fCsVars == 0) {
        ppvVar3 = pMan->vCos->pArray;
      }
      else {
        ppvVar3 = pMan->vCis->pArray;
        uVar4 = uVar6;
      }
      Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)ppvVar3[uVar4] + 0x24)]);
      iVar5 = iVar5 + 1;
      iVar1 = pMan->nRegs;
    } while (iVar5 < iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveLatchVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf, int fCsVars )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pMan) );
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
        Vec_IntPush( vVars, pCnf->pVarNums[fCsVars? pObjLo->Id : pObjLi->Id] );
    return vVars;
}